

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

void __thiscall
jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::basic_json<long,void>
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this,long *val)

{
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  json_type_traits<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_long,_void>
  ::to_json((long)in_RDI);
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
            (in_stack_ffffffffffffffe0,in_RDI);
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x369f91);
  return;
}

Assistant:

basic_json(const T& val)
            : basic_json(json_type_traits<basic_json,T>::to_json(val))
        {
        }